

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O2

ogt_mesh_vec2i get_cardinal_unit_vector(ogt_mesh_vec2i *vec)

{
  int iVar1;
  int iVar2;
  ogt_mesh_vec2i oVar3;
  ogt_mesh_vec2i oVar4;
  ogt_mesh_vec2i oVar5;
  
  iVar1 = vec->x;
  iVar2 = vec->y;
  if (iVar2 != 0 && iVar1 == 0) {
    oVar5.x = 0;
    oVar5.y = 1;
    oVar4.x = 0;
    oVar4.y = -1;
    if (-1 < iVar2) {
      oVar4 = oVar5;
    }
    return oVar4;
  }
  if ((iVar1 != 0) && (iVar2 == 0)) {
    oVar3.x = 1;
    oVar3.y = 0;
    if (iVar1 < 0) {
      oVar3.x = -1;
      oVar3.y = 0;
    }
    return oVar3;
  }
  __assert_fail("(vec.x == 0 && vec.y != 0) || (vec.y == 0 && vec.x != 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x426,"ogt_mesh_vec2i get_cardinal_unit_vector(const ogt_mesh_vec2i &)");
}

Assistant:

ogt_mesh_vec2i get_cardinal_unit_vector(const ogt_mesh_vec2i& vec) {
    assert((vec.x == 0 && vec.y != 0) || (vec.y == 0 && vec.x != 0));	// assumes this is a cardinal vector	
    if (vec.x <= -1) return make_vec2i(-1, 0);
    if (vec.x >=  1) return make_vec2i( 1, 0);
    if (vec.y <= -1) return make_vec2i( 0,-1);
    if (vec.y >=  1) return make_vec2i( 0, 1);
    assert(0); // unreachable unless the above assert already failed!
    return make_vec2i(0,0);
}